

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O0

void ycc_rgb_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                    JSAMPARRAY output_buf,int num_rows)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  jpeg_color_deconverter *pjVar4;
  JSAMPLE *pJVar5;
  _func_void_j_decompress_ptr *p_Var6;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var7;
  _func_void_j_decompress_ptr *p_Var8;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var9;
  JSAMPROW pJVar10;
  JSAMPROW pJVar11;
  JSAMPROW pJVar12;
  uint uVar13;
  JSAMPARRAY ppJVar14;
  JSAMPROW pJVar15;
  int cr;
  int cb;
  int y;
  my_cconvert_ptr_conflict cconvert;
  JLONG *Cbgtab_1;
  JLONG *Crgtab_1;
  int *Cbbtab_1;
  int *Crrtab_1;
  JSAMPLE *range_limit_1;
  JDIMENSION num_cols_1;
  JDIMENSION col_1;
  JSAMPROW inptr2_1;
  JSAMPROW inptr1_1;
  JSAMPROW inptr0_1;
  JSAMPROW outptr_1;
  int cr_1;
  int cb_1;
  int y_1;
  my_cconvert_ptr_conflict cconvert_1;
  JLONG *Cbgtab_2;
  JLONG *Crgtab_2;
  int *Cbbtab_2;
  int *Crrtab_2;
  JSAMPLE *range_limit_2;
  JDIMENSION num_cols_2;
  JDIMENSION col_2;
  JSAMPROW inptr2_2;
  JSAMPROW inptr1_2;
  JSAMPROW inptr0_2;
  JSAMPROW outptr_2;
  int cr_2;
  int cb_2;
  int y_2;
  my_cconvert_ptr_conflict cconvert_2;
  JLONG *Cbgtab_3;
  JLONG *Crgtab_3;
  int *Cbbtab_3;
  int *Crrtab_3;
  JSAMPLE *range_limit_3;
  JDIMENSION num_cols_3;
  JDIMENSION col_3;
  JSAMPROW inptr2_3;
  JSAMPROW inptr1_3;
  JSAMPROW inptr0_3;
  JSAMPROW outptr_3;
  int cr_3;
  int cb_3;
  int y_3;
  my_cconvert_ptr_conflict cconvert_3;
  JLONG *Cbgtab_4;
  JLONG *Crgtab_4;
  int *Cbbtab_4;
  int *Crrtab_4;
  JSAMPLE *range_limit_4;
  JDIMENSION num_cols_4;
  JDIMENSION col_4;
  JSAMPROW inptr2_4;
  JSAMPROW inptr1_4;
  JSAMPROW inptr0_4;
  JSAMPROW outptr_4;
  int cr_4;
  int cb_4;
  int y_4;
  my_cconvert_ptr_conflict cconvert_4;
  JLONG *Cbgtab_5;
  JLONG *Crgtab_5;
  int *Cbbtab_5;
  int *Crrtab_5;
  JSAMPLE *range_limit_5;
  JDIMENSION num_cols_5;
  JDIMENSION col_5;
  JSAMPROW inptr2_5;
  JSAMPROW inptr1_5;
  JSAMPROW inptr0_5;
  JSAMPROW outptr_5;
  int cr_5;
  int cb_5;
  int y_5;
  my_cconvert_ptr_conflict cconvert_5;
  JLONG *Cbgtab_6;
  JLONG *Crgtab_6;
  int *Cbbtab_6;
  int *Crrtab_6;
  JSAMPLE *range_limit_6;
  JDIMENSION num_cols_6;
  JDIMENSION col_6;
  JSAMPROW inptr2_6;
  JSAMPROW inptr1_6;
  JSAMPROW inptr0_6;
  JSAMPROW outptr_6;
  int cr_6;
  int cb_6;
  int y_6;
  my_cconvert_ptr_conflict cconvert_6;
  uint local_3c4;
  JSAMPROW local_3a8;
  int local_384;
  JSAMPARRAY local_380;
  uint local_374;
  uint local_334;
  JSAMPROW local_318;
  int local_2f4;
  JSAMPARRAY local_2f0;
  uint local_2e4;
  uint local_2a4;
  JSAMPROW local_288;
  int local_264;
  JSAMPARRAY local_260;
  uint local_254;
  uint local_214;
  JSAMPROW local_1f8;
  int local_1d4;
  JSAMPARRAY local_1d0;
  uint local_1c4;
  uint local_184;
  JSAMPROW local_168;
  int local_144;
  JSAMPARRAY local_140;
  uint local_134;
  uint local_f4;
  JSAMPROW local_d8;
  int local_b4;
  JSAMPARRAY local_b0;
  uint local_a4;
  int num_rows_local;
  JSAMPARRAY output_buf_local;
  JDIMENSION input_row_local;
  JSAMPIMAGE input_buf_local;
  j_decompress_ptr cinfo_local;
  JLONG *Cbgtab;
  JLONG *Crgtab;
  int *Cbbtab;
  int *Crrtab;
  JSAMPLE *range_limit;
  JDIMENSION num_cols;
  JDIMENSION col;
  JSAMPROW inptr2;
  JSAMPROW inptr1;
  JSAMPROW inptr0;
  JSAMPROW outptr;
  
  switch(cinfo->out_color_space) {
  case JCS_EXT_RGB:
    pjVar4 = cinfo->cconvert;
    uVar3 = cinfo->output_width;
    pJVar5 = cinfo->sample_range_limit;
    p_Var6 = pjVar4[1].start_pass;
    p_Var7 = pjVar4[1].color_convert;
    p_Var8 = pjVar4[2].start_pass;
    p_Var9 = pjVar4[2].color_convert;
    local_384 = num_rows;
    local_380 = output_buf;
    local_374 = input_row;
    while (local_384 = local_384 + -1, -1 < local_384) {
      pJVar10 = (*input_buf)[local_374];
      pJVar11 = input_buf[1][local_374];
      pJVar12 = input_buf[2][local_374];
      local_374 = local_374 + 1;
      ppJVar14 = local_380 + 1;
      local_3a8 = *local_380;
      for (local_3c4 = 0; local_380 = ppJVar14, local_3c4 < uVar3; local_3c4 = local_3c4 + 1) {
        uVar13 = (uint)pJVar10[local_3c4];
        bVar1 = pJVar11[local_3c4];
        bVar2 = pJVar12[local_3c4];
        *local_3a8 = pJVar5[(int)(uVar13 + *(int *)(p_Var6 + (long)(int)(uint)bVar2 * 4))];
        local_3a8[1] = pJVar5[(int)(uVar13 + (int)((ulong)(*(long *)(p_Var9 + (long)(int)(uint)bVar1
                                                                              * 8) +
                                                          *(long *)(p_Var8 + (long)(int)(uint)bVar2
                                                                             * 8)) >> 0x10))];
        local_3a8[2] = pJVar5[(int)(uVar13 + *(int *)(p_Var7 + (long)(int)(uint)bVar1 * 4))];
        local_3a8 = local_3a8 + 3;
      }
    }
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    pjVar4 = cinfo->cconvert;
    uVar3 = cinfo->output_width;
    pJVar5 = cinfo->sample_range_limit;
    p_Var6 = pjVar4[1].start_pass;
    p_Var7 = pjVar4[1].color_convert;
    p_Var8 = pjVar4[2].start_pass;
    p_Var9 = pjVar4[2].color_convert;
    local_2f4 = num_rows;
    local_2f0 = output_buf;
    local_2e4 = input_row;
    while (local_2f4 = local_2f4 + -1, -1 < local_2f4) {
      pJVar10 = (*input_buf)[local_2e4];
      pJVar11 = input_buf[1][local_2e4];
      pJVar12 = input_buf[2][local_2e4];
      local_2e4 = local_2e4 + 1;
      ppJVar14 = local_2f0 + 1;
      local_318 = *local_2f0;
      for (local_334 = 0; local_2f0 = ppJVar14, local_334 < uVar3; local_334 = local_334 + 1) {
        uVar13 = (uint)pJVar10[local_334];
        bVar1 = pJVar11[local_334];
        bVar2 = pJVar12[local_334];
        *local_318 = pJVar5[(int)(uVar13 + *(int *)(p_Var6 + (long)(int)(uint)bVar2 * 4))];
        local_318[1] = pJVar5[(int)(uVar13 + (int)((ulong)(*(long *)(p_Var9 + (long)(int)(uint)bVar1
                                                                              * 8) +
                                                          *(long *)(p_Var8 + (long)(int)(uint)bVar2
                                                                             * 8)) >> 0x10))];
        local_318[2] = pJVar5[(int)(uVar13 + *(int *)(p_Var7 + (long)(int)(uint)bVar1 * 4))];
        local_318[3] = 0xff;
        local_318 = local_318 + 4;
      }
    }
    break;
  case JCS_EXT_BGR:
    pjVar4 = cinfo->cconvert;
    uVar3 = cinfo->output_width;
    pJVar5 = cinfo->sample_range_limit;
    p_Var6 = pjVar4[1].start_pass;
    p_Var7 = pjVar4[1].color_convert;
    p_Var8 = pjVar4[2].start_pass;
    p_Var9 = pjVar4[2].color_convert;
    local_264 = num_rows;
    local_260 = output_buf;
    local_254 = input_row;
    while (local_264 = local_264 + -1, -1 < local_264) {
      pJVar10 = (*input_buf)[local_254];
      pJVar11 = input_buf[1][local_254];
      pJVar12 = input_buf[2][local_254];
      local_254 = local_254 + 1;
      ppJVar14 = local_260 + 1;
      local_288 = *local_260;
      for (local_2a4 = 0; local_260 = ppJVar14, local_2a4 < uVar3; local_2a4 = local_2a4 + 1) {
        uVar13 = (uint)pJVar10[local_2a4];
        bVar1 = pJVar11[local_2a4];
        bVar2 = pJVar12[local_2a4];
        local_288[2] = pJVar5[(int)(uVar13 + *(int *)(p_Var6 + (long)(int)(uint)bVar2 * 4))];
        local_288[1] = pJVar5[(int)(uVar13 + (int)((ulong)(*(long *)(p_Var9 + (long)(int)(uint)bVar1
                                                                              * 8) +
                                                          *(long *)(p_Var8 + (long)(int)(uint)bVar2
                                                                             * 8)) >> 0x10))];
        *local_288 = pJVar5[(int)(uVar13 + *(int *)(p_Var7 + (long)(int)(uint)bVar1 * 4))];
        local_288 = local_288 + 3;
      }
    }
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    pjVar4 = cinfo->cconvert;
    uVar3 = cinfo->output_width;
    pJVar5 = cinfo->sample_range_limit;
    p_Var6 = pjVar4[1].start_pass;
    p_Var7 = pjVar4[1].color_convert;
    p_Var8 = pjVar4[2].start_pass;
    p_Var9 = pjVar4[2].color_convert;
    local_1d4 = num_rows;
    local_1d0 = output_buf;
    local_1c4 = input_row;
    while (local_1d4 = local_1d4 + -1, -1 < local_1d4) {
      pJVar10 = (*input_buf)[local_1c4];
      pJVar11 = input_buf[1][local_1c4];
      pJVar12 = input_buf[2][local_1c4];
      local_1c4 = local_1c4 + 1;
      ppJVar14 = local_1d0 + 1;
      local_1f8 = *local_1d0;
      for (local_214 = 0; local_1d0 = ppJVar14, local_214 < uVar3; local_214 = local_214 + 1) {
        uVar13 = (uint)pJVar10[local_214];
        bVar1 = pJVar11[local_214];
        bVar2 = pJVar12[local_214];
        local_1f8[2] = pJVar5[(int)(uVar13 + *(int *)(p_Var6 + (long)(int)(uint)bVar2 * 4))];
        local_1f8[1] = pJVar5[(int)(uVar13 + (int)((ulong)(*(long *)(p_Var9 + (long)(int)(uint)bVar1
                                                                              * 8) +
                                                          *(long *)(p_Var8 + (long)(int)(uint)bVar2
                                                                             * 8)) >> 0x10))];
        *local_1f8 = pJVar5[(int)(uVar13 + *(int *)(p_Var7 + (long)(int)(uint)bVar1 * 4))];
        local_1f8[3] = 0xff;
        local_1f8 = local_1f8 + 4;
      }
    }
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    pjVar4 = cinfo->cconvert;
    uVar3 = cinfo->output_width;
    pJVar5 = cinfo->sample_range_limit;
    p_Var6 = pjVar4[1].start_pass;
    p_Var7 = pjVar4[1].color_convert;
    p_Var8 = pjVar4[2].start_pass;
    p_Var9 = pjVar4[2].color_convert;
    local_144 = num_rows;
    local_140 = output_buf;
    local_134 = input_row;
    while (local_144 = local_144 + -1, -1 < local_144) {
      pJVar10 = (*input_buf)[local_134];
      pJVar11 = input_buf[1][local_134];
      pJVar12 = input_buf[2][local_134];
      local_134 = local_134 + 1;
      ppJVar14 = local_140 + 1;
      local_168 = *local_140;
      for (local_184 = 0; local_140 = ppJVar14, local_184 < uVar3; local_184 = local_184 + 1) {
        uVar13 = (uint)pJVar10[local_184];
        bVar1 = pJVar11[local_184];
        bVar2 = pJVar12[local_184];
        local_168[3] = pJVar5[(int)(uVar13 + *(int *)(p_Var6 + (long)(int)(uint)bVar2 * 4))];
        local_168[2] = pJVar5[(int)(uVar13 + (int)((ulong)(*(long *)(p_Var9 + (long)(int)(uint)bVar1
                                                                              * 8) +
                                                          *(long *)(p_Var8 + (long)(int)(uint)bVar2
                                                                             * 8)) >> 0x10))];
        local_168[1] = pJVar5[(int)(uVar13 + *(int *)(p_Var7 + (long)(int)(uint)bVar1 * 4))];
        *local_168 = 0xff;
        local_168 = local_168 + 4;
      }
    }
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    pjVar4 = cinfo->cconvert;
    uVar3 = cinfo->output_width;
    pJVar5 = cinfo->sample_range_limit;
    p_Var6 = pjVar4[1].start_pass;
    p_Var7 = pjVar4[1].color_convert;
    p_Var8 = pjVar4[2].start_pass;
    p_Var9 = pjVar4[2].color_convert;
    local_b4 = num_rows;
    local_b0 = output_buf;
    local_a4 = input_row;
    while (local_b4 = local_b4 + -1, -1 < local_b4) {
      pJVar10 = (*input_buf)[local_a4];
      pJVar11 = input_buf[1][local_a4];
      pJVar12 = input_buf[2][local_a4];
      local_a4 = local_a4 + 1;
      ppJVar14 = local_b0 + 1;
      local_d8 = *local_b0;
      for (local_f4 = 0; local_b0 = ppJVar14, local_f4 < uVar3; local_f4 = local_f4 + 1) {
        uVar13 = (uint)pJVar10[local_f4];
        bVar1 = pJVar11[local_f4];
        bVar2 = pJVar12[local_f4];
        local_d8[1] = pJVar5[(int)(uVar13 + *(int *)(p_Var6 + (long)(int)(uint)bVar2 * 4))];
        local_d8[2] = pJVar5[(int)(uVar13 + (int)((ulong)(*(long *)(p_Var9 + (long)(int)(uint)bVar1
                                                                             * 8) +
                                                         *(long *)(p_Var8 + (long)(int)(uint)bVar2 *
                                                                            8)) >> 0x10))];
        local_d8[3] = pJVar5[(int)(uVar13 + *(int *)(p_Var7 + (long)(int)(uint)bVar1 * 4))];
        *local_d8 = 0xff;
        local_d8 = local_d8 + 4;
      }
    }
    break;
  default:
    pjVar4 = cinfo->cconvert;
    uVar3 = cinfo->output_width;
    pJVar5 = cinfo->sample_range_limit;
    p_Var6 = pjVar4[1].start_pass;
    p_Var7 = pjVar4[1].color_convert;
    p_Var8 = pjVar4[2].start_pass;
    p_Var9 = pjVar4[2].color_convert;
    col = num_rows;
    inptr2 = (JSAMPROW)output_buf;
    inptr1._4_4_ = input_row;
    while (col = col - 1, -1 < (int)col) {
      pJVar10 = (*input_buf)[inptr1._4_4_];
      pJVar11 = input_buf[1][inptr1._4_4_];
      pJVar12 = input_buf[2][inptr1._4_4_];
      inptr1._4_4_ = inptr1._4_4_ + 1;
      pJVar15 = inptr2 + 8;
      Crgtab = *(JLONG **)inptr2;
      for (input_row_local = 0; inptr2 = pJVar15, input_row_local < uVar3;
          input_row_local = input_row_local + 1) {
        uVar13 = (uint)pJVar10[input_row_local];
        bVar1 = pJVar11[input_row_local];
        bVar2 = pJVar12[input_row_local];
        *(JSAMPLE *)Crgtab = pJVar5[(int)(uVar13 + *(int *)(p_Var6 + (long)(int)(uint)bVar2 * 4))];
        *(JSAMPLE *)((long)Crgtab + 1) =
             pJVar5[(int)(uVar13 + (int)((ulong)(*(long *)(p_Var9 + (long)(int)(uint)bVar1 * 8) +
                                                *(long *)(p_Var8 + (long)(int)(uint)bVar2 * 8)) >>
                                        0x10))];
        *(JSAMPLE *)((long)Crgtab + 2) =
             pJVar5[(int)(uVar13 + *(int *)(p_Var7 + (long)(int)(uint)bVar1 * 4))];
        Crgtab = (JLONG *)((long)Crgtab + 3);
      }
    }
  }
  return;
}

Assistant:

METHODDEF(void)
ycc_rgb_convert(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                JDIMENSION input_row, JSAMPARRAY output_buf, int num_rows)
{
  switch (cinfo->out_color_space) {
  case JCS_EXT_RGB:
    ycc_extrgb_convert_internal(cinfo, input_buf, input_row, output_buf,
                                num_rows);
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    ycc_extrgbx_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  case JCS_EXT_BGR:
    ycc_extbgr_convert_internal(cinfo, input_buf, input_row, output_buf,
                                num_rows);
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    ycc_extbgrx_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    ycc_extxbgr_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    ycc_extxrgb_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  default:
    ycc_rgb_convert_internal(cinfo, input_buf, input_row, output_buf,
                             num_rows);
    break;
  }
}